

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void lys_node_unlink(lys_node *node)

{
  lys_node *plVar1;
  bool bVar2;
  lys_node *plVar3;
  LY_STMT stmt;
  lys_module *plVar4;
  lys_node **pplVar5;
  LYS_NODE LVar6;
  lys_node *plVar7;
  lys_node **pplVar8;
  lys_node *ext;
  
  if (node == (lys_node *)0x0) {
    return;
  }
  plVar4 = node->module;
  if (plVar4 != (lys_module *)0x0) {
    if ((plVar4->field_0x40 & 1) != 0) {
      plVar4 = (lys_module *)plVar4->data;
    }
    if (plVar4->data == node) {
      plVar4->data = node->next;
    }
  }
  ext = node->parent;
  bVar2 = true;
  if (ext == (lys_node *)0x0) {
LAB_0015a650:
    ext = (lys_node *)0x0;
    pplVar8 = (lys_node **)0x0;
    goto LAB_0015a674;
  }
  LVar6 = ext->nodetype;
  if (LVar6 == LYS_AUGMENT) {
    if (ext->child == node) {
      plVar1 = node->next;
      plVar7 = (lys_node *)0x0;
      if ((plVar1 != (lys_node *)0x0) && (plVar1->parent == ext)) {
        plVar7 = plVar1;
      }
      ext->child = plVar7;
    }
    if (((ext->flags & 1) != 0) || (ext = ext->prev, ext == (lys_node *)0x0)) goto LAB_0015a650;
    LVar6 = ext->nodetype;
  }
  if (LVar6 == LYS_EXT) {
    stmt = lys_snode2stmt(node->nodetype);
    pplVar5 = (lys_node **)
              lys_ext_complex_get_substmt
                        (stmt,(lys_ext_instance_complex *)ext,(lyext_substmt **)0x0);
    pplVar8 = pplVar5;
    if (*pplVar5 == node) {
LAB_0015a663:
      *pplVar5 = node->next;
    }
  }
  else {
    pplVar8 = (lys_node **)0x0;
    if (ext->child == node) {
      pplVar5 = &ext->child;
      goto LAB_0015a663;
    }
  }
  node->parent = (lys_node *)0x0;
  bVar2 = false;
LAB_0015a674:
  if (node->prev != node) {
    plVar1 = node->next;
    plVar7 = plVar1;
    if (plVar1 == (lys_node *)0x0) {
      plVar3 = node;
      if (bVar2) {
        do {
          plVar7 = plVar3;
          plVar3 = plVar7->prev;
        } while (plVar7->prev->next != (lys_node *)0x0);
      }
      else {
        pplVar5 = &ext->child;
        if (ext->nodetype == LYS_EXT) {
          pplVar5 = pplVar8;
        }
        plVar7 = *pplVar5;
      }
    }
    plVar7->prev = node->prev;
    if (node->prev->next != (lys_node *)0x0) {
      node->prev->next = plVar1;
    }
    node->next = (lys_node *)0x0;
    node->prev = node;
  }
  return;
}

Assistant:

void
lys_node_unlink(struct lys_node *node)
{
    struct lys_node *parent, *first, **pp = NULL;
    struct lys_module *main_module;

    if (!node) {
        return;
    }

    /* unlink from data model if necessary */
    if (node->module) {
        /* get main module with data tree */
        main_module = lys_node_module(node);
        if (main_module->data == node) {
            main_module->data = node->next;
        }
    }

    /* store pointers to important nodes */
    parent = node->parent;
    if (parent && (parent->nodetype == LYS_AUGMENT)) {
        /* handle augments - first, unlink it from the augment parent ... */
        if (parent->child == node) {
            parent->child = (node->next && node->next->parent == parent) ? node->next : NULL;
        }

        if (parent->flags & LYS_NOTAPPLIED) {
            /* data are not connected in the target, so we cannot continue with the target as a parent */
            parent = NULL;
        } else {
            /* data are connected in target, so we will continue with the target as a parent */
            parent = ((struct lys_node_augment *)parent)->target;
        }
    }

    /* unlink from parent */
    if (parent) {
        if (parent->nodetype == LYS_EXT) {
            pp = (struct lys_node **)lys_ext_complex_get_substmt(lys_snode2stmt(node->nodetype),
                                                                 (struct lys_ext_instance_complex*)parent, NULL);
            if (*pp == node) {
                *pp = node->next;
            }
        } else if (parent->child == node) {
            parent->child = node->next;
        }
        node->parent = NULL;
    }

    /* unlink from siblings */
    if (node->prev == node) {
        /* there are no more siblings */
        return;
    }
    if (node->next) {
        node->next->prev = node->prev;
    } else {
        /* unlinking the last element */
        if (parent) {
            if (parent->nodetype == LYS_EXT) {
                first = *(struct lys_node **)pp;
            } else {
                first = parent->child;
            }
        } else {
            first = node;
            while (first->prev->next) {
                first = first->prev;
            }
        }
        first->prev = node->prev;
    }
    if (node->prev->next) {
        node->prev->next = node->next;
    }

    /* clean up the unlinked element */
    node->next = NULL;
    node->prev = node;
}